

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_send(nghttp2_session *session)

{
  uint8_t **ppuVar1;
  nghttp2_send_callback2 p_Var2;
  size_t sVar3;
  long lVar4;
  uint8_t *data;
  uint8_t *local_20;
  
  local_20 = (uint8_t *)0x0;
  sVar3 = nghttp2_session_mem_send_internal(session,&local_20,0);
  if (0 < (long)sVar3) {
    do {
      p_Var2 = (session->callbacks).send_callback2;
      if (p_Var2 == (nghttp2_send_callback2)0x0) {
        lVar4 = (*(session->callbacks).send_callback)(session,local_20,sVar3,0,session->user_data);
      }
      else {
        lVar4 = (*p_Var2)(session,local_20,sVar3,0,session->user_data);
      }
      if (lVar4 < 0) {
        if (lVar4 != -0x1f8) {
          return -0x386;
        }
        ppuVar1 = &(((session->aob).framebufs.cur)->buf).pos;
        *ppuVar1 = *ppuVar1 + -sVar3;
        return 0;
      }
      ppuVar1 = &(((session->aob).framebufs.cur)->buf).pos;
      *ppuVar1 = *ppuVar1 + (lVar4 - sVar3);
      sVar3 = nghttp2_session_mem_send_internal(session,&local_20,0);
    } while (0 < (long)sVar3);
  }
  return (int)sVar3;
}

Assistant:

int nghttp2_session_send(nghttp2_session *session) {
  const uint8_t *data = NULL;
  nghttp2_ssize datalen;
  nghttp2_ssize sentlen;
  nghttp2_bufs *framebufs;

  framebufs = &session->aob.framebufs;

  for (;;) {
    datalen = nghttp2_session_mem_send_internal(session, &data, 0);
    if (datalen <= 0) {
      return (int)datalen;
    }
    if (session->callbacks.send_callback2) {
      sentlen = session->callbacks.send_callback2(
        session, data, (size_t)datalen, 0, session->user_data);
    } else {
      sentlen = (nghttp2_ssize)session->callbacks.send_callback(
        session, data, (size_t)datalen, 0, session->user_data);
    }
    if (sentlen < 0) {
      if (sentlen == NGHTTP2_ERR_WOULDBLOCK) {
        /* Transmission canceled. Rewind the offset */
        framebufs->cur->buf.pos -= datalen;

        return 0;
      }
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    /* Rewind the offset to the amount of unsent bytes */
    framebufs->cur->buf.pos -= datalen - sentlen;
  }
}